

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

PatternPtr __thiscall trieste::detail::Inside<7UL>::custom_rep(Inside<7UL> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  PatternPtr PVar2;
  Token local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  if (*(long *)(in_RSI + 8) == 0) {
    std::make_shared<trieste::detail::InsideStar<7ul>,std::array<trieste::Token,7ul>&>
              ((array<trieste::Token,_7UL> *)&stack0xffffffffffffffe8);
    _Var1._M_pi = _Stack_10._M_pi;
    _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_PatternDef)._vptr_PatternDef = (_func_int **)local_18.def;
    (this->super_PatternDef).continuation.
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var1._M_pi;
    local_18.def = (TokenDef *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xfffffffffffffff0);
    in_RDX._M_pi = extraout_RDX;
  }
  else {
    (this->super_PatternDef)._vptr_PatternDef = (_func_int **)0x0;
    (this->super_PatternDef).continuation.
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  PVar2.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = in_RDX._M_pi;
  PVar2.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_PatternDef;
  return (PatternPtr)
         PVar2.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PatternPtr custom_rep() override
      {
        // Rep(Inside) -> InsideStar
        if (no_continuation())
          return std::make_shared<InsideStar<N>>(types);
        return {};
      }